

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.h
# Opt level: O0

double __thiscall CEPlanet::XCoordinate_Rad(CEPlanet *this,double new_date)

{
  long *in_RDI;
  undefined8 in_XMM0_Qa;
  double dVar1;
  CEDateType in_stack_ffffffffffffff94;
  double in_stack_ffffffffffffff98;
  CEDate *in_stack_ffffffffffffffa0;
  CEAngle local_20 [2];
  
  (**(code **)(*in_RDI + 0x70))(in_XMM0_Qa);
  CppEphem::julian_date_J2000();
  CEDate::CEDate(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  (**(code **)(*in_RDI + 0x18))(local_20,in_RDI,&stack0xffffffffffffffa0);
  dVar1 = CEAngle::Rad(local_20);
  CEAngle::~CEAngle((CEAngle *)0x1627bc);
  CEDate::~CEDate((CEDate *)0x1627c6);
  return dVar1;
}

Assistant:

inline
double CEPlanet::XCoordinate_Rad(double new_date) const
{
    UpdateCoordinates(new_date);
    return XCoord().Rad();
}